

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::DEC_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  byte data;
  
  this->cycles = 7;
  uVar2 = GetWord(this);
  uVar2 = this->X + uVar2;
  bVar1 = ReadByte(this,uVar2);
  this->cycles = this->cycles - 2;
  data = (byte)(bVar1 - 1);
  WriteByte(this,uVar2,data);
  (this->field_6).ps = data & 0x80 | ((ushort)(bVar1 - 1) == 0) * '\x02' | (this->field_6).ps & 0x7d
  ;
  return;
}

Assistant:

void CPU::DEC_AB_X()
{
    cycles = 7;
    uint16_t addr = GetWord() + X, result = ReadByte(addr) - 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}